

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

void __thiscall
QHttpHeadersPrivate::values(QHttpHeadersPrivate *this,HeaderName *name,QList<QByteArray> *result)

{
  bool bVar1;
  HeaderName *lhs;
  const_iterator o;
  Header *rhs;
  long in_RDI;
  long in_FS_OFFSET;
  Header *h;
  add_const_t<const_QList<Header>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = (HeaderName *)(in_RDI + 8);
  local_10.i = (Header *)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<Header>::begin((QList<Header> *)lhs);
  o = QList<Header>::end((QList<Header> *)lhs);
  while (bVar1 = QList<Header>::const_iterator::operator!=(&local_10,o), bVar1) {
    rhs = QList<Header>::const_iterator::operator*(&local_10);
    bVar1 = ::operator==(lhs,&rhs->name);
    if (bVar1) {
      QList<QByteArray>::append((QList<QByteArray> *)lhs,(parameter_type)rhs);
    }
    QList<Header>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpHeadersPrivate::values(const HeaderName &name, QList<QByteArray> &result) const
{
    for (const auto &h : std::as_const(headers)) {
        if (h.name == name)
            result.append(h.value);
    }
}